

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

Var Js::JavascriptString::EntryRaw(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptLibrary *pJVar7;
  int64 iVar8;
  Var index;
  uint local_2e4;
  ulong local_2d0;
  int64 j;
  uint local_2c0;
  uint32 argsCount;
  uint32 i;
  uint32 loopMax;
  anon_class_16_2_2579f24f append;
  Builder<256U> stringBuilder;
  JavascriptString *string;
  Var var;
  int64 length;
  Var rawVar;
  RecyclableObject *raw;
  RecyclableObject *callSite;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x616,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  callSite = (RecyclableObject *)RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x619,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((uint)scriptContext & 0xffffff) < 2) {
    JavascriptError::ThrowTypeError((ScriptContext *)callSite,-0x7ff5ec36,L"String.raw");
  }
  pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
  BVar3 = JavascriptConversion::ToObject(pvVar6,(ScriptContext *)callSite,&raw);
  if (BVar3 == 0) {
    JavascriptError::ThrowTypeError((ScriptContext *)callSite,-0x7ff5ec36,L"String.raw");
  }
  BVar3 = RecyclableObject::GetProperty
                    (raw,raw,0x12a,(Var *)&length,(PropertyValueInfo *)0x0,(ScriptContext *)callSite
                    );
  if (BVar3 == 0) {
    pJVar7 = ScriptContext::GetLibrary((ScriptContext *)callSite);
    length = (int64)JavascriptLibraryBase::GetUndefined(&pJVar7->super_JavascriptLibraryBase);
  }
  BVar3 = JavascriptConversion::ToObject
                    ((Var)length,(ScriptContext *)callSite,(RecyclableObject **)&rawVar);
  if (BVar3 != 0) {
    pvVar6 = Js::JavascriptOperators::OP_GetLength(rawVar,(ScriptContext *)callSite);
    iVar8 = JavascriptConversion::ToLength(pvVar6,(ScriptContext *)callSite);
    if (iVar8 < 1) {
      pJVar7 = ScriptContext::GetLibrary((ScriptContext *)callSite);
      callInfo_local = (CallInfo)JavascriptLibrary::GetEmptyString(pJVar7);
    }
    else {
      pvVar6 = Js::JavascriptOperators::OP_GetElementI_UInt32(rawVar,0,(ScriptContext *)callSite);
      callInfo_local = (CallInfo)JavascriptConversion::ToString(pvVar6,(ScriptContext *)callSite);
      if (iVar8 != 1) {
        CompoundString::Builder<256U>::Builder
                  ((Builder<256U> *)&append.stringBuilder,(ScriptContext *)callSite);
        CompoundString::Builder<256U>::Append
                  ((Builder<256U> *)&append.stringBuilder,(JavascriptString *)callInfo_local);
        _i = (ScriptContext **)&callSite;
        append.scriptContext = (ScriptContext **)&append.stringBuilder;
        if (iVar8 < 0xffffffff) {
          local_2e4 = (uint)iVar8;
        }
        else {
          local_2e4 = 0xfffffffe;
        }
        for (local_2c0 = 1; local_2c0 < local_2e4; local_2c0 = local_2c0 + 1) {
          if (local_2c0 + 1 < ((uint)scriptContext & 0xffffff)) {
            pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,local_2c0 + 1);
            EntryRaw::anon_class_16_2_2579f24f::operator()((anon_class_16_2_2579f24f *)&i,pvVar6);
          }
          pvVar6 = Js::JavascriptOperators::OP_GetElementI_UInt32
                             (rawVar,local_2c0,(ScriptContext *)callSite);
          EntryRaw::anon_class_16_2_2579f24f::operator()((anon_class_16_2_2579f24f *)&i,pvVar6);
        }
        for (local_2d0 = (ulong)local_2c0; pvVar6 = rawVar, (long)local_2d0 < iVar8;
            local_2d0 = local_2d0 + 1) {
          index = JavascriptNumber::ToVar(local_2d0,(ScriptContext *)callSite);
          pvVar6 = Js::JavascriptOperators::OP_GetElementI(pvVar6,index,(ScriptContext *)callSite);
          EntryRaw::anon_class_16_2_2579f24f::operator()((anon_class_16_2_2579f24f *)&i,pvVar6);
        }
        callInfo_local =
             (CallInfo)
             CompoundString::Builder<256U>::ToString((Builder<256U> *)&append.stringBuilder);
      }
    }
    return (Var)callInfo_local;
  }
  JavascriptError::ThrowTypeError((ScriptContext *)callSite,-0x7ff5ec36,L"String.raw");
}

Assistant:

Var JavascriptString::EntryRaw(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count < 2)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("String.raw"));
        }

        RecyclableObject* callSite;
        RecyclableObject* raw;
        Var rawVar;

        // Call ToObject on the first argument to get the callSite (which is also cooked string array)
        // ToObject returns false if the parameter is null or undefined
        if (!JavascriptConversion::ToObject(args[1], scriptContext, &callSite))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("String.raw"));
        }

        // Get the raw property from the callSite object
        if (!callSite->GetProperty(callSite, Js::PropertyIds::raw, &rawVar, nullptr, scriptContext))
        {
            rawVar = scriptContext->GetLibrary()->GetUndefined();
        }

        if (!JavascriptConversion::ToObject(rawVar, scriptContext, &raw))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("String.raw"));
        }

        int64 length = JavascriptConversion::ToLength(JavascriptOperators::OP_GetLength(raw, scriptContext), scriptContext);

        // If there are no raw strings (somehow), return empty string
        if (length <= 0)
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        // Get the first raw string
        Var var = JavascriptOperators::OP_GetElementI_UInt32(raw, 0, scriptContext);
        JavascriptString* string = JavascriptConversion::ToString(var, scriptContext);

        // If there is only one raw string, just return that one raw string (doesn't matter if there are replacements)
        if (length == 1)
        {
            return string;
        }

        // We aren't going to bail early so let's create a StringBuilder and put the first raw string in there
        CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)> stringBuilder(scriptContext);
        stringBuilder.Append(string);

        // Each raw string is followed by a substitution expression except for the last one
        // We will always have one more string constant than substitution expression
        // `strcon1 ${expr1} strcon2 ${expr2} strcon3` = strcon1 + expr1 + strcon2 + expr2 + strcon3
        //
        // strcon1 --- step 1 (above)
        // expr1   \__ step 2
        // strcon2 /
        // expr2   \__ step 3
        // strcon3 /
        const auto append = [&] (Var var)
        {
            JavascriptString* string = JavascriptConversion::ToString(var, scriptContext);
                stringBuilder.Append(string);
        };
        uint32 loopMax = length >= UINT_MAX ? UINT_MAX-1 : (uint32)length;
        uint32 i = 1;
        uint32 argsCount = args.Info.Count;
        for (; i < loopMax; ++i)
        {
            // First append the next substitution expression if available
            if (i + 1 < argsCount)
            {
                append(args[i + 1]);
            }

            // Then append the next string (this will also cover the final string case)
            append(JavascriptOperators::OP_GetElementI_UInt32(raw, i, scriptContext));
        }

        // Length can be greater than uint32 max (unlikely in practice)
        for (int64 j = (int64)i; j < length; ++j)
        {
            // Append whatever is left in the array/object
            append(JavascriptOperators::OP_GetElementI(raw, JavascriptNumber::ToVar(j, scriptContext), scriptContext));
        }

        // CompoundString::Builder has saved our lives
        return stringBuilder.ToString();
    }